

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper_tests.cpp
# Opt level: O1

void __thiscall
dbwrapper_tests::existing_data_no_obfuscate::test_method(existing_data_no_obfuscate *this)

{
  long lVar1;
  pointer puVar2;
  pointer puVar3;
  unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_> this_00;
  char cVar4;
  readonly_property<bool> rVar5;
  int iVar6;
  __uniq_ptr_data<CDBWrapper,_std::default_delete<CDBWrapper>,_true,_true> this_01;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar7;
  ulong uVar8;
  iterator in_R8;
  iterator pvVar9;
  iterator in_R9;
  iterator pvVar10;
  FastRandomContext *this_02;
  long in_FS_OFFSET;
  bool bVar11;
  Span<std::byte> output;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  Span<std::byte> output_00;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  check_type cVar12;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  uint8_t key;
  unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_> dbw;
  string *local_290;
  assertion_result local_288;
  string **local_270;
  string *local_268;
  string *local_260;
  char *local_258;
  assertion_result local_250;
  string local_238;
  string local_218;
  undefined1 local_1f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  uint256 res3;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1a0;
  size_t local_188;
  undefined4 local_180;
  CDBWrapper odbw;
  uint256 in2;
  uint256 res2;
  uint256 res;
  uint256 in;
  path local_88;
  path ph;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDir
            ((path *)&local_88,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args,false);
  std::filesystem::__cxx11::path::_M_append(&local_88,0x1a,"existing_data_no_obfuscate");
  std::filesystem::__cxx11::path::path(&ph.super_path,&local_88);
  std::filesystem::__cxx11::path::~path(&local_88);
  cVar4 = std::filesystem::symlink_status(&ph.super_path);
  if (cVar4 == '\x03') {
    cVar4 = std::filesystem::status(&ph.super_path);
    if (cVar4 == '\x02') goto LAB_00381e57;
  }
  std::filesystem::create_directories(&ph.super_path);
LAB_00381e57:
  std::filesystem::__cxx11::path::path((path *)&odbw,&ph.super_path);
  odbw.obfuscate_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x400;
  odbw.obfuscate_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  this_01.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t.
  super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
  super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl =
       (__uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>)operator_new(0x70);
  CDBWrapper::CDBWrapper
            ((CDBWrapper *)
             this_01.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t.
             super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
             super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl,(DBParams *)&odbw);
  dbw._M_t.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t.
  super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
  super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl =
       (__uniq_ptr_data<CDBWrapper,_std::default_delete<CDBWrapper>,_true,_true>)
       (__uniq_ptr_data<CDBWrapper,_std::default_delete<CDBWrapper>,_true,_true>)
       this_01.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t.
       super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
       super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl;
  std::filesystem::__cxx11::path::~path((path *)&odbw);
  key = 'k';
  this_02 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng;
  in.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  output.m_size = 0x20;
  output.m_data = (byte *)&in;
  FastRandomContext::fillrand(this_02,output);
  res.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xda;
  file.m_begin = (iterator)&local_2b0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2c0,msg);
  _cVar12 = 0x381f60;
  rVar5.super_class_property<bool>.value =
       (class_property<bool>)
       CDBWrapper::Write<unsigned_char,uint256>
                 ((CDBWrapper *)
                  dbw._M_t.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t.
                  super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
                  super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl,&key,&in,false);
  local_1b0._8_8_ = (element_type *)0x0;
  aStack_1a0._M_allocated_capacity = 0;
  local_288._0_8_ = "dbw->Write(key, in)";
  local_288.m_message.px = (element_type *)0xe7f4a6;
  odbw.m_name._M_dataplus._M_p._0_1_ = 0;
  odbw.m_db_context._M_t.super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>
  ._M_t.super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
  super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl =
       (__uniq_ptr_data<LevelDBContext,_std::default_delete<LevelDBContext>,_true,_true>)
       &PTR__lazy_ostream_013abc70;
  odbw.m_name._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_2c8 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  odbw.m_name.field_2._M_allocated_capacity = (size_type)&local_288;
  local_1b0[0] = rVar5.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1b0,(lazy_ostream *)&odbw,1,0,WARN,_cVar12,(size_t)&local_2d0
             ,0xda);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_1a0._M_allocated_capacity);
  local_2e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xdb;
  file_00.m_begin = (iterator)&local_2e0;
  msg_00.m_end = pvVar10;
  msg_00.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2f0,
             msg_00);
  _cVar12 = 0x382048;
  local_1b0[0] = (class_property<bool>)
                 CDBWrapper::Read<unsigned_char,uint256>
                           ((CDBWrapper *)
                            dbw._M_t.
                            super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t
                            .super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
                            super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl,&key,&res);
  local_1b0._8_8_ = (element_type *)0x0;
  aStack_1a0._M_allocated_capacity = 0;
  local_288._0_8_ = "dbw->Read(key, res)";
  local_288.m_message.px = (element_type *)0xe7f4ba;
  odbw.m_name._M_dataplus._M_p._0_1_ = 0;
  odbw.m_db_context._M_t.super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>
  ._M_t.super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
  super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl =
       (__uniq_ptr_data<LevelDBContext,_std::default_delete<LevelDBContext>,_true,_true>)
       &PTR__lazy_ostream_013abc70;
  odbw.m_name._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_300 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_2f8 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  odbw.m_name.field_2._M_allocated_capacity = (size_type)&local_288;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1b0,(lazy_ostream *)&odbw,1,0,WARN,_cVar12,(size_t)&local_300
             ,0xdb);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_1a0._M_allocated_capacity);
  local_310 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xdc;
  file_01.m_begin = (iterator)&local_310;
  msg_01.m_end = pvVar10;
  msg_01.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_320,
             msg_01);
  local_288.m_message.px = (element_type *)((ulong)local_288.m_message.px & 0xffffffffffffff00);
  local_288._0_8_ = &PTR__lazy_ostream_013abb30;
  local_288.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_270 = (string **)0xf6cf21;
  base_blob<256u>::ToString_abi_cxx11_((string *)&res2,&res);
  base_blob<256u>::ToString_abi_cxx11_((string *)&in2,&in);
  if (res2.super_base_blob<256U>.m_data._M_elems._8_8_ ==
      in2.super_base_blob<256U>.m_data._M_elems._8_8_) {
    if (res2.super_base_blob<256U>.m_data._M_elems._8_8_ == 0) {
      bVar11 = true;
    }
    else {
      iVar6 = bcmp((void *)res2.super_base_blob<256U>.m_data._M_elems._0_8_,
                   (void *)in2.super_base_blob<256U>.m_data._M_elems._0_8_,
                   res2.super_base_blob<256U>.m_data._M_elems._8_8_);
      bVar11 = iVar6 == 0;
    }
  }
  else {
    bVar11 = false;
  }
  res3.super_base_blob<256U>.m_data._M_elems[0] = bVar11;
  res3.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_1f8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_1f8._8_8_ = "";
  odbw.m_name.field_2._M_allocated_capacity = (size_type)&local_218;
  odbw.m_name._M_dataplus._M_p._0_1_ = 0;
  odbw.m_db_context._M_t.super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>
  ._M_t.super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
  super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl =
       (__uniq_ptr_data<LevelDBContext,_std::default_delete<LevelDBContext>,_true,_true>)
       &PTR__lazy_ostream_013abbf0;
  odbw.m_name._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_1a0._8_8_ = &local_238;
  local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
  local_1b0._0_8_ = &PTR__lazy_ostream_013abbf0;
  aStack_1a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  local_238._M_dataplus._M_p = (pointer)&in2;
  local_218._M_dataplus._M_p = (pointer)&res2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&res3,(lazy_ostream *)&local_288,1,2,REQUIRE,0xe7f469,
             (size_t)local_1f8,0xdc,&odbw,"in.ToString()",(assertion_result *)local_1b0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(res3.super_base_blob<256U>.m_data._M_elems + 0x10));
  if ((uchar *)in2.super_base_blob<256U>.m_data._M_elems._0_8_ !=
      in2.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete((void *)in2.super_base_blob<256U>.m_data._M_elems._0_8_,
                    in2.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
  }
  if ((uchar *)res2.super_base_blob<256U>.m_data._M_elems._0_8_ !=
      res2.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete((void *)res2.super_base_blob<256U>.m_data._M_elems._0_8_,
                    res2.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
  }
  this_00._M_t.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t.
  super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
  super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl =
       dbw._M_t.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t.
       super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
       super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl;
  dbw._M_t.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t.
  super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
  super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl =
       (__uniq_ptr_data<CDBWrapper,_std::default_delete<CDBWrapper>,_true,_true>)
       (__uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>)0x0;
  if ((__uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>)
      this_00._M_t.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t.
      super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
      super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>)0x0) {
    CDBWrapper::~CDBWrapper
              ((CDBWrapper *)
               this_00._M_t.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t
               .super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
               super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl);
    operator_delete((void *)this_00._M_t.
                            super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t
                            .super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
                            super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl,0x70);
  }
  std::filesystem::__cxx11::path::path((path *)local_1b0,&ph.super_path);
  local_188 = 0x400;
  local_180._0_1_ = false;
  local_180._1_1_ = false;
  local_180._2_1_ = true;
  local_180._3_1_ = false;
  CDBWrapper::CDBWrapper(&odbw,(DBParams *)local_1b0);
  std::filesystem::__cxx11::path::~path((path *)local_1b0);
  res2.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_330 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_328 = "";
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0xe7;
  file_02.m_begin = (iterator)&local_330;
  msg_02.m_end = pvVar10;
  msg_02.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_340,
             msg_02);
  _cVar12 = 0x3823c3;
  bVar11 = CDBWrapper::Read<unsigned_char,uint256>(&odbw,&key,&res2);
  local_288.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar11;
  local_288.m_message.px = (element_type *)0x0;
  local_288.m_message.pn.pi_ = (sp_counted_base *)0x0;
  in2.super_base_blob<256U>.m_data._M_elems._0_8_ = (long)"!odbw.Read(key, res2)" + 1;
  in2.super_base_blob<256U>.m_data._M_elems._8_8_ = (long)"!odbw.Read(key, res2)" + 0x15;
  local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
  local_1b0._0_8_ = &PTR__lazy_ostream_013abc70;
  aStack_1a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_350 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_348 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  aStack_1a0._8_8_ = (string *)&in2;
  boost::test_tools::tt_detail::report_assertion
            (&local_288,(lazy_ostream *)local_1b0,1,0,WARN,_cVar12,(size_t)&local_350,0xe7);
  boost::detail::shared_count::~shared_count(&local_288.m_message.pn);
  local_360 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_358 = "";
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xe8;
  file_03.m_begin = (iterator)&local_360;
  msg_03.m_end = pvVar10;
  msg_03.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_370,
             msg_03);
  in2.super_base_blob<256U>.m_data._M_elems._8_8_ =
       in2.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  in2.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013abb30;
  in2.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  in2.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  base_blob<256u>::ToString_abi_cxx11_((string *)&res3,&res2);
  base_blob<256u>::ToString_abi_cxx11_((string *)local_1f8,&in);
  if (res3.super_base_blob<256U>.m_data._M_elems._8_8_ == local_1f8._8_8_) {
    if (res3.super_base_blob<256U>.m_data._M_elems._8_8_ == 0) {
      bVar11 = true;
    }
    else {
      iVar6 = bcmp((void *)res3.super_base_blob<256U>.m_data._M_elems._0_8_,(void *)local_1f8._0_8_,
                   res3.super_base_blob<256U>.m_data._M_elems._8_8_);
      bVar11 = iVar6 == 0;
    }
  }
  else {
    bVar11 = false;
  }
  local_218._M_dataplus._M_p._0_1_ = bVar11;
  local_218._M_string_length = 0;
  local_218.field_2._M_allocated_capacity = 0;
  local_238._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_238._M_string_length = 0xe7ef04;
  aStack_1a0._8_8_ = &local_250;
  local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
  local_1b0._0_8_ = &PTR__lazy_ostream_013abbf0;
  aStack_1a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_270 = &local_260;
  local_288.m_message.px = (element_type *)((ulong)local_288.m_message.px & 0xffffffffffffff00);
  local_288._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_288.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  local_260 = (string *)local_1f8;
  local_250._0_8_ = (string *)&res3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_218,(lazy_ostream *)&in2,1,2,REQUIRE,0xe7f4bb,
             (size_t)&local_238,0xe8,(lazy_ostream *)local_1b0,"in.ToString()",&local_288);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_218.field_2._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._0_8_ != &local_1e8) {
    operator_delete((void *)local_1f8._0_8_,local_1e8._M_allocated_capacity + 1);
  }
  if ((uchar *)res3.super_base_blob<256U>.m_data._M_elems._0_8_ !=
      res3.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete((void *)res3.super_base_blob<256U>.m_data._M_elems._0_8_,
                    res3.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
  }
  local_380 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_378 = "";
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0xea;
  file_04.m_begin = (iterator)&local_380;
  msg_04.m_end = pvVar10;
  msg_04.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_390,
             msg_04);
  _cVar12 = 0x3826a7;
  bVar11 = CDBWrapper::IsEmpty(&odbw);
  local_288.m_message.px = (element_type *)0x0;
  local_288.m_message.pn.pi_ = (sp_counted_base *)0x0;
  in2.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_8421e9;
  in2.super_base_blob<256U>.m_data._M_elems._8_8_ = (long)"!odbw.IsEmpty()" + 0xf;
  local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
  local_1b0._0_8_ = &PTR__lazy_ostream_013abc70;
  aStack_1a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_3a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_398 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  aStack_1a0._8_8_ = (lazy_ostream *)&in2;
  local_288.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar11;
  boost::test_tools::tt_detail::report_assertion
            (&local_288,(lazy_ostream *)local_1b0,1,0,WARN,_cVar12,(size_t)&local_3a0,0xea);
  boost::detail::shared_count::~shared_count(&local_288.m_message.pn);
  local_3b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_3a8 = "";
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0xeb;
  file_05.m_begin = (iterator)&local_3b0;
  msg_05.m_end = pvVar10;
  msg_05.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_3c0,
             msg_05);
  _cVar12 = 0x382782;
  pvVar7 = dbwrapper_private::GetObfuscateKey(&odbw);
  puVar2 = (pvVar7->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (pvVar7->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_288.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  if (puVar3 != puVar2) {
    uVar8 = 0;
    do {
      local_288.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)
           ((byte)local_288.p_predicate_value.super_readonly_property<bool>.
                  super_class_property<bool>.value & puVar2[uVar8] == '\0');
      uVar8 = uVar8 + 1;
    } while ((uVar8 & 0xffffffff) < (ulong)((long)puVar3 - (long)puVar2));
  }
  local_288.m_message.px = (element_type *)0x0;
  local_288.m_message.pn.pi_ = (sp_counted_base *)0x0;
  in2.super_base_blob<256U>.m_data._M_elems._0_8_ =
       (long)"!is_null_key(dbwrapper_private::GetObfuscateKey(odbw))" + 1;
  in2.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (long)"!is_null_key(dbwrapper_private::GetObfuscateKey(odbw))" + 0x36;
  local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
  local_1b0._0_8_ = &PTR__lazy_ostream_013abc70;
  aStack_1a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_3d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_3c8 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  aStack_1a0._8_8_ = (lazy_ostream *)&in2;
  boost::test_tools::tt_detail::report_assertion
            (&local_288,(lazy_ostream *)local_1b0,1,0,WARN,_cVar12,(size_t)&local_3d0,0xeb);
  boost::detail::shared_count::~shared_count(&local_288.m_message.pn);
  in2.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  output_00.m_size = 0x20;
  output_00.m_data = (byte *)&in2;
  FastRandomContext::fillrand(this_02,output_00);
  res3.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_3e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_3d8 = "";
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0xf1;
  file_06.m_begin = (iterator)&local_3e0;
  msg_06.m_end = pvVar10;
  msg_06.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_3f0,
             msg_06);
  _cVar12 = 0x3828be;
  local_288.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)CDBWrapper::Write<unsigned_char,uint256>(&odbw,&key,&in2,false);
  local_288.m_message.px = (element_type *)0x0;
  local_288.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f8._0_8_ = "odbw.Write(key, in2)";
  local_1f8._8_8_ = "";
  local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
  local_1b0._0_8_ = &PTR__lazy_ostream_013abc70;
  aStack_1a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_400 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_3f8 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  aStack_1a0._8_8_ = (string *)local_1f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_288,(lazy_ostream *)local_1b0,1,0,WARN,_cVar12,(size_t)&local_400,0xf1);
  boost::detail::shared_count::~shared_count(&local_288.m_message.pn);
  local_410 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_408 = "";
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0xf2;
  file_07.m_begin = (iterator)&local_410;
  msg_07.m_end = pvVar10;
  msg_07.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_420,
             msg_07);
  _cVar12 = 0x382997;
  local_288.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)CDBWrapper::Read<unsigned_char,uint256>(&odbw,&key,&res3);
  local_288.m_message.px = (element_type *)0x0;
  local_288.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f8._0_8_ = "odbw.Read(key, res3)";
  local_1f8._8_8_ = "";
  local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
  local_1b0._0_8_ = &PTR__lazy_ostream_013abc70;
  aStack_1a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_430 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_428 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  aStack_1a0._8_8_ = (string *)local_1f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_288,(lazy_ostream *)local_1b0,1,0,WARN,_cVar12,(size_t)&local_430,0xf2);
  boost::detail::shared_count::~shared_count(&local_288.m_message.pn);
  local_440 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_438 = "";
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0xf3;
  file_08.m_begin = (iterator)&local_440;
  msg_08.m_end = pvVar10;
  msg_08.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_450,
             msg_08);
  local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffffffffff00;
  local_1f8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_1e8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1e8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  base_blob<256u>::ToString_abi_cxx11_(&local_218,&res3);
  base_blob<256u>::ToString_abi_cxx11_(&local_238,&in2);
  if (local_218._M_string_length == local_238._M_string_length) {
    if ((char *)local_218._M_string_length == (char *)0x0) {
      bVar11 = true;
    }
    else {
      iVar6 = bcmp(local_218._M_dataplus._M_p,local_238._M_dataplus._M_p,local_218._M_string_length)
      ;
      bVar11 = iVar6 == 0;
    }
  }
  else {
    bVar11 = false;
  }
  local_250.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar11;
  local_250.m_message.px = (element_type *)0x0;
  local_250.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260 = (string *)0xe7ee9c;
  local_258 = "";
  aStack_1a0._8_8_ = &local_268;
  local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
  local_1b0._0_8_ = &PTR__lazy_ostream_013abbf0;
  aStack_1a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_270 = &local_290;
  local_288.m_message.px = (element_type *)((ulong)local_288.m_message.px & 0xffffffffffffff00);
  local_288._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_288.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_290 = &local_238;
  local_268 = &local_218;
  boost::test_tools::tt_detail::report_assertion
            (&local_250,(lazy_ostream *)local_1f8,1,2,REQUIRE,0xe7f505,(size_t)&local_260,0xf3,
             (lazy_ostream *)local_1b0,"in2.ToString()",&local_288);
  boost::detail::shared_count::~shared_count(&local_250.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  CDBWrapper::~CDBWrapper(&odbw);
  std::unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_>::~unique_ptr(&dbw);
  std::filesystem::__cxx11::path::~path(&ph.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(existing_data_no_obfuscate)
{
    // We're going to share this fs::path between two wrappers
    fs::path ph = m_args.GetDataDirBase() / "existing_data_no_obfuscate";
    fs::create_directories(ph);

    // Set up a non-obfuscated wrapper to write some initial data.
    std::unique_ptr<CDBWrapper> dbw = std::make_unique<CDBWrapper>(DBParams{.path = ph, .cache_bytes = 1 << 10, .memory_only = false, .wipe_data = false, .obfuscate = false});
    uint8_t key{'k'};
    uint256 in = m_rng.rand256();
    uint256 res;

    BOOST_CHECK(dbw->Write(key, in));
    BOOST_CHECK(dbw->Read(key, res));
    BOOST_CHECK_EQUAL(res.ToString(), in.ToString());

    // Call the destructor to free leveldb LOCK
    dbw.reset();

    // Now, set up another wrapper that wants to obfuscate the same directory
    CDBWrapper odbw({.path = ph, .cache_bytes = 1 << 10, .memory_only = false, .wipe_data = false, .obfuscate = true});

    // Check that the key/val we wrote with unobfuscated wrapper exists and
    // is readable.
    uint256 res2;
    BOOST_CHECK(odbw.Read(key, res2));
    BOOST_CHECK_EQUAL(res2.ToString(), in.ToString());

    BOOST_CHECK(!odbw.IsEmpty()); // There should be existing data
    BOOST_CHECK(is_null_key(dbwrapper_private::GetObfuscateKey(odbw))); // The key should be an empty string

    uint256 in2 = m_rng.rand256();
    uint256 res3;

    // Check that we can write successfully
    BOOST_CHECK(odbw.Write(key, in2));
    BOOST_CHECK(odbw.Read(key, res3));
    BOOST_CHECK_EQUAL(res3.ToString(), in2.ToString());
}